

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_scan_sse2_128_16.c
# Opt level: O1

parasail_result_t *
parasail_nw_scan_profile_sse2_128_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  ushort *puVar1;
  short *psVar2;
  void *pvVar3;
  parasail_matrix_t *ppVar4;
  short sVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  ulong uVar8;
  int iVar9;
  parasail_result_t *ppVar10;
  __m128i *ptr;
  int16_t *ptr_00;
  __m128i *ptr_01;
  __m128i *ptr_02;
  __m128i *ptr_03;
  int iVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  int16_t iVar15;
  int iVar16;
  __m128i *palVar17;
  int iVar18;
  uint uVar19;
  long lVar20;
  undefined2 uVar21;
  long lVar22;
  long lVar23;
  ulong uVar24;
  ulong uVar25;
  int32_t segNum;
  long lVar26;
  int iVar27;
  ulong uVar28;
  int iVar29;
  undefined4 uVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  __m128i alVar39;
  undefined1 auVar40 [16];
  ushort uVar41;
  ushort uVar47;
  ushort uVar48;
  ushort uVar49;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  short sVar50;
  short sVar57;
  short sVar58;
  short sVar59;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar61 [16];
  ushort uVar62;
  ushort uVar64;
  ushort uVar65;
  ushort uVar66;
  ushort uVar67;
  ushort uVar68;
  ushort uVar69;
  undefined1 auVar63 [16];
  ushort uVar70;
  __m128i_16_t e;
  __m128i_16_t h;
  longlong local_58;
  longlong lStack_50;
  longlong local_48;
  longlong lStack_40;
  short sVar30;
  short sVar35;
  undefined1 auVar53 [16];
  short sVar60;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_nw_scan_profile_sse2_128_16_cold_8();
  }
  else {
    pvVar3 = (profile->profile16).score;
    if (pvVar3 == (void *)0x0) {
      parasail_nw_scan_profile_sse2_128_16_cold_7();
    }
    else {
      ppVar4 = profile->matrix;
      if (ppVar4 == (parasail_matrix_t *)0x0) {
        parasail_nw_scan_profile_sse2_128_16_cold_6();
      }
      else {
        uVar13 = profile->s1Len;
        if ((int)uVar13 < 1) {
          parasail_nw_scan_profile_sse2_128_16_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_nw_scan_profile_sse2_128_16_cold_4();
        }
        else if (s2Len < 1) {
          parasail_nw_scan_profile_sse2_128_16_cold_3();
        }
        else if (open < 0) {
          parasail_nw_scan_profile_sse2_128_16_cold_2();
        }
        else if (gap < 0) {
          parasail_nw_scan_profile_sse2_128_16_cold_1();
        }
        else {
          iVar18 = uVar13 - 1;
          uVar28 = (ulong)uVar13 + 7 >> 3;
          iVar27 = (int)uVar28;
          iVar29 = -open;
          iVar14 = ppVar4->min;
          iVar16 = -iVar14;
          if (iVar14 != iVar29 && SBORROW4(iVar14,iVar29) == iVar14 + open < 0) {
            iVar16 = open;
          }
          iVar9 = ppVar4->max;
          ppVar10 = parasail_result_new();
          if (ppVar10 != (parasail_result_t *)0x0) {
            ppVar10->flag = ppVar10->flag | 0x8200401;
            ptr = parasail_memalign___m128i(0x10,uVar28);
            ptr_00 = parasail_memalign_int16_t(0x10,(ulong)(s2Len + 1));
            ptr_01 = parasail_memalign___m128i(0x10,uVar28);
            ptr_02 = parasail_memalign___m128i(0x10,uVar28);
            ptr_03 = parasail_memalign___m128i(0x10,uVar28);
            if (ptr_03 != (__m128i *)0x0 &&
                ((ptr_02 != (__m128i *)0x0 && ptr_01 != (__m128i *)0x0) &&
                (ptr_00 != (int16_t *)0x0 && ptr != (__m128i *)0x0))) {
              iVar11 = s2Len + -1;
              iVar12 = 7 - iVar18 / iVar27;
              auVar32 = pshuflw(ZEXT416((uint)open),ZEXT416((uint)open),0);
              uVar31 = auVar32._0_4_;
              auVar37._4_4_ = uVar31;
              auVar37._0_4_ = uVar31;
              auVar37._8_4_ = uVar31;
              auVar37._12_4_ = uVar31;
              auVar32 = pshuflw(ZEXT416((uint)gap),ZEXT416((uint)gap),0);
              uVar31 = auVar32._0_4_;
              uVar13 = iVar16 - 0x7fff;
              auVar32 = pshuflw(ZEXT416(uVar13),ZEXT416(uVar13),0);
              auVar33._0_4_ = auVar32._0_4_;
              auVar33._4_4_ = auVar33._0_4_;
              auVar33._8_4_ = auVar33._0_4_;
              auVar33._12_4_ = auVar33._0_4_;
              auVar36 = ZEXT416(CONCAT22((short)((uint)iVar14 >> 0x10),0x7ffe - (short)iVar9));
              auVar36 = pshuflw(auVar36,auVar36,0);
              auVar46._0_4_ = auVar36._0_4_;
              auVar46._4_4_ = auVar46._0_4_;
              auVar46._8_4_ = auVar46._0_4_;
              auVar46._12_4_ = auVar46._0_4_;
              auVar38 = pshuflw(ZEXT416((uint)-(iVar27 * gap)),ZEXT416((uint)-(iVar27 * gap)),0);
              uVar19 = auVar38._0_4_;
              auVar38._0_8_ = CONCAT44(uVar19,uVar19);
              auVar38._8_4_ = uVar19;
              auVar38._12_4_ = uVar19;
              auVar63._0_8_ = auVar38._0_8_ << 0x10;
              auVar63._8_8_ = auVar38._8_8_ << 0x10 | (ulong)(uVar19 >> 0x10);
              auVar38 = paddsw(auVar63,ZEXT416(uVar13 & 0xffff));
              lVar20 = (long)iVar29;
              uVar25 = 0;
              do {
                lVar26 = 0;
                lVar23 = lVar20;
                do {
                  uVar21 = 0x8000;
                  if (-0x8000 < lVar23) {
                    uVar21 = (undefined2)lVar23;
                  }
                  *(undefined2 *)((long)&local_48 + lVar26 * 2) = uVar21;
                  lVar22 = lVar23 - (ulong)(uint)open;
                  if (lVar22 < -0x7fff) {
                    lVar22 = -0x8000;
                  }
                  *(short *)((long)&local_58 + lVar26 * 2) = (short)lVar22;
                  lVar26 = lVar26 + 1;
                  lVar23 = lVar23 - uVar28 * (uint)gap;
                } while (lVar26 != 8);
                ptr_02[uVar25][0] = local_48;
                ptr_02[uVar25][1] = lStack_40;
                ptr[uVar25][0] = local_58;
                ptr[uVar25][1] = lStack_50;
                uVar25 = uVar25 + 1;
                lVar20 = lVar20 - (ulong)(uint)gap;
              } while (uVar25 != uVar28);
              *ptr_00 = 0;
              uVar25 = 1;
              do {
                iVar15 = -0x8000;
                if (-0x8000 < iVar29) {
                  iVar15 = (int16_t)iVar29;
                }
                ptr_00[uVar25] = iVar15;
                uVar25 = uVar25 + 1;
                iVar29 = iVar29 - gap;
              } while (s2Len + 1 != uVar25);
              alVar39 = (__m128i)psubsw((undefined1  [16])0x0,auVar37);
              palVar17 = ptr_03 + (iVar27 - 1U);
              uVar25 = uVar28;
              do {
                *palVar17 = alVar39;
                auVar40._4_4_ = uVar31;
                auVar40._0_4_ = uVar31;
                auVar40._8_4_ = uVar31;
                auVar40._12_4_ = uVar31;
                alVar39 = (__m128i)psubsw((undefined1  [16])alVar39,auVar40);
                palVar17 = palVar17 + -1;
                iVar14 = (int)uVar25;
                uVar19 = iVar14 - 1;
                uVar25 = (ulong)uVar19;
              } while (uVar19 != 0 && 0 < iVar14);
              uVar25 = 1;
              if (1 < s2Len) {
                uVar25 = (ulong)(uint)s2Len;
              }
              lVar20 = (ulong)(iVar27 + (uint)(iVar27 == 0)) << 4;
              uVar24 = 0;
              auVar56 = auVar33;
              do {
                uVar8 = ptr_02[iVar27 - 1U][0];
                auVar43._8_8_ = ptr_02[iVar27 - 1U][1] << 0x10 | uVar8 >> 0x30;
                auVar43._0_8_ = uVar8 << 0x10 | (ulong)(ushort)ptr_00[uVar24];
                iVar14 = ppVar4->mapper[(byte)s2[uVar24]];
                auVar42 = psubsw(auVar33,(undefined1  [16])*ptr_03);
                lVar23 = 0;
                auVar63 = auVar33;
                do {
                  auVar40 = *(undefined1 (*) [16])((long)*ptr_02 + lVar23);
                  auVar61 = paddsw(auVar43,*(undefined1 (*) [16])
                                            ((long)pvVar3 + lVar23 + (long)iVar14 * uVar28 * 0x10));
                  auVar43 = paddsw(auVar42,*(undefined1 (*) [16])((long)*ptr_03 + lVar23));
                  auVar6._4_4_ = uVar31;
                  auVar6._0_4_ = uVar31;
                  auVar6._8_4_ = uVar31;
                  auVar6._12_4_ = uVar31;
                  auVar42 = psubsw(*(undefined1 (*) [16])((long)*ptr + lVar23),auVar6);
                  sVar30 = auVar43._0_2_;
                  sVar35 = auVar63._0_2_;
                  auVar51._0_2_ =
                       (ushort)(sVar35 < sVar30) * sVar30 | (ushort)(sVar35 >= sVar30) * sVar35;
                  sVar30 = auVar43._2_2_;
                  sVar35 = auVar63._2_2_;
                  auVar51._2_2_ =
                       (ushort)(sVar35 < sVar30) * sVar30 | (ushort)(sVar35 >= sVar30) * sVar35;
                  sVar30 = auVar43._4_2_;
                  sVar35 = auVar63._4_2_;
                  auVar51._4_2_ =
                       (ushort)(sVar35 < sVar30) * sVar30 | (ushort)(sVar35 >= sVar30) * sVar35;
                  sVar30 = auVar43._6_2_;
                  sVar35 = auVar63._6_2_;
                  auVar51._6_2_ =
                       (ushort)(sVar35 < sVar30) * sVar30 | (ushort)(sVar35 >= sVar30) * sVar35;
                  sVar30 = auVar43._8_2_;
                  sVar35 = auVar63._8_2_;
                  auVar51._8_2_ =
                       (ushort)(sVar35 < sVar30) * sVar30 | (ushort)(sVar35 >= sVar30) * sVar35;
                  sVar30 = auVar43._10_2_;
                  sVar35 = auVar63._10_2_;
                  auVar51._10_2_ =
                       (ushort)(sVar35 < sVar30) * sVar30 | (ushort)(sVar35 >= sVar30) * sVar35;
                  sVar30 = auVar43._12_2_;
                  sVar35 = auVar63._12_2_;
                  sVar60 = auVar63._14_2_;
                  auVar51._12_2_ =
                       (ushort)(sVar35 < sVar30) * sVar30 | (ushort)(sVar35 >= sVar30) * sVar35;
                  sVar30 = auVar43._14_2_;
                  auVar51._14_2_ =
                       (ushort)(sVar60 < sVar30) * sVar30 | (ushort)(sVar60 >= sVar30) * sVar60;
                  auVar63 = psubsw(auVar40,auVar37);
                  sVar30 = auVar42._0_2_;
                  sVar35 = auVar63._0_2_;
                  uVar62 = (ushort)(sVar35 < sVar30) * sVar30 | (ushort)(sVar35 >= sVar30) * sVar35;
                  sVar30 = auVar42._2_2_;
                  sVar35 = auVar63._2_2_;
                  uVar64 = (ushort)(sVar35 < sVar30) * sVar30 | (ushort)(sVar35 >= sVar30) * sVar35;
                  sVar30 = auVar42._4_2_;
                  sVar35 = auVar63._4_2_;
                  uVar65 = (ushort)(sVar35 < sVar30) * sVar30 | (ushort)(sVar35 >= sVar30) * sVar35;
                  sVar30 = auVar42._6_2_;
                  sVar35 = auVar63._6_2_;
                  uVar66 = (ushort)(sVar35 < sVar30) * sVar30 | (ushort)(sVar35 >= sVar30) * sVar35;
                  sVar30 = auVar42._8_2_;
                  sVar35 = auVar63._8_2_;
                  uVar67 = (ushort)(sVar35 < sVar30) * sVar30 | (ushort)(sVar35 >= sVar30) * sVar35;
                  sVar30 = auVar42._10_2_;
                  sVar35 = auVar63._10_2_;
                  uVar68 = (ushort)(sVar35 < sVar30) * sVar30 | (ushort)(sVar35 >= sVar30) * sVar35;
                  sVar30 = auVar42._12_2_;
                  sVar35 = auVar63._12_2_;
                  sVar60 = auVar63._14_2_;
                  uVar69 = (ushort)(sVar35 < sVar30) * sVar30 | (ushort)(sVar35 >= sVar30) * sVar35;
                  sVar30 = auVar42._14_2_;
                  uVar70 = (ushort)(sVar60 < sVar30) * sVar30 | (ushort)(sVar60 >= sVar30) * sVar60;
                  sVar30 = auVar61._0_2_;
                  uVar41 = (sVar30 < (short)uVar62) * uVar62 |
                           (ushort)(sVar30 >= (short)uVar62) * sVar30;
                  sVar30 = auVar61._2_2_;
                  uVar47 = (sVar30 < (short)uVar64) * uVar64 |
                           (ushort)(sVar30 >= (short)uVar64) * sVar30;
                  sVar30 = auVar61._4_2_;
                  uVar48 = (sVar30 < (short)uVar65) * uVar65 |
                           (ushort)(sVar30 >= (short)uVar65) * sVar30;
                  sVar30 = auVar61._6_2_;
                  uVar49 = (sVar30 < (short)uVar66) * uVar66 |
                           (ushort)(sVar30 >= (short)uVar66) * sVar30;
                  auVar42._0_8_ = CONCAT26(uVar49,CONCAT24(uVar48,CONCAT22(uVar47,uVar41)));
                  sVar30 = auVar61._8_2_;
                  auVar42._8_2_ =
                       (sVar30 < (short)uVar67) * uVar67 |
                       (ushort)(sVar30 >= (short)uVar67) * sVar30;
                  sVar30 = auVar61._10_2_;
                  auVar42._10_2_ =
                       (sVar30 < (short)uVar68) * uVar68 |
                       (ushort)(sVar30 >= (short)uVar68) * sVar30;
                  sVar30 = auVar61._12_2_;
                  sVar35 = auVar61._14_2_;
                  auVar42._12_2_ =
                       (sVar30 < (short)uVar69) * uVar69 |
                       (ushort)(sVar30 >= (short)uVar69) * sVar30;
                  auVar42._14_2_ =
                       (sVar35 < (short)uVar70) * uVar70 |
                       (ushort)(sVar35 >= (short)uVar70) * sVar35;
                  puVar1 = (ushort *)((long)*ptr + lVar23);
                  *puVar1 = uVar62;
                  puVar1[1] = uVar64;
                  puVar1[2] = uVar65;
                  puVar1[3] = uVar66;
                  puVar1[4] = uVar67;
                  puVar1[5] = uVar68;
                  puVar1[6] = uVar69;
                  puVar1[7] = uVar70;
                  *(undefined1 (*) [16])((long)*ptr_01 + lVar23) = auVar42;
                  lVar23 = lVar23 + 0x10;
                  auVar63 = auVar51;
                  auVar43 = auVar40;
                } while (lVar20 != lVar23);
                auVar44._8_8_ = auVar42._8_8_ << 0x10 | (ulong)uVar49;
                uVar62 = ptr_00[uVar24 + 1];
                auVar44._0_8_ = auVar42._0_8_ << 0x10 | (ulong)uVar62;
                uVar24 = uVar24 + 1;
                auVar63 = paddsw((undefined1  [16])*ptr_03,auVar44);
                sVar30 = auVar63._0_2_;
                auVar61._0_2_ =
                     (ushort)((short)auVar51._0_2_ < sVar30) * sVar30 |
                     ((short)auVar51._0_2_ >= sVar30) * auVar51._0_2_;
                sVar30 = auVar63._2_2_;
                auVar61._2_2_ =
                     (ushort)((short)auVar51._2_2_ < sVar30) * sVar30 |
                     ((short)auVar51._2_2_ >= sVar30) * auVar51._2_2_;
                sVar30 = auVar63._4_2_;
                auVar61._4_2_ =
                     (ushort)((short)auVar51._4_2_ < sVar30) * sVar30 |
                     ((short)auVar51._4_2_ >= sVar30) * auVar51._4_2_;
                sVar30 = auVar63._6_2_;
                auVar61._6_2_ =
                     (ushort)((short)auVar51._6_2_ < sVar30) * sVar30 |
                     ((short)auVar51._6_2_ >= sVar30) * auVar51._6_2_;
                sVar30 = auVar63._8_2_;
                auVar61._8_2_ =
                     (ushort)((short)auVar51._8_2_ < sVar30) * sVar30 |
                     ((short)auVar51._8_2_ >= sVar30) * auVar51._8_2_;
                sVar30 = auVar63._10_2_;
                auVar61._10_2_ =
                     (ushort)((short)auVar51._10_2_ < sVar30) * sVar30 |
                     ((short)auVar51._10_2_ >= sVar30) * auVar51._10_2_;
                sVar30 = auVar63._12_2_;
                auVar61._12_2_ =
                     (ushort)((short)auVar51._12_2_ < sVar30) * sVar30 |
                     ((short)auVar51._12_2_ >= sVar30) * auVar51._12_2_;
                sVar30 = auVar63._14_2_;
                auVar61._14_2_ =
                     (ushort)((short)auVar51._14_2_ < sVar30) * sVar30 |
                     ((short)auVar51._14_2_ >= sVar30) * auVar51._14_2_;
                iVar14 = 6;
                do {
                  auVar52._0_8_ = auVar61._0_8_ << 0x10;
                  auVar52._8_8_ = auVar61._8_8_ << 0x10 | auVar61._0_8_ >> 0x30;
                  auVar63 = paddsw(auVar52,auVar38);
                  sVar30 = auVar61._0_2_;
                  sVar50 = auVar63._0_2_;
                  sVar35 = auVar61._2_2_;
                  sVar57 = auVar63._2_2_;
                  sVar60 = auVar61._4_2_;
                  sVar58 = auVar63._4_2_;
                  sVar5 = auVar61._6_2_;
                  sVar59 = auVar63._6_2_;
                  uVar64 = (ushort)(sVar59 < sVar5) * sVar5 | (ushort)(sVar59 >= sVar5) * sVar59;
                  auVar53._0_8_ =
                       CONCAT26(uVar64,CONCAT24((ushort)(sVar58 < sVar60) * sVar60 |
                                                (ushort)(sVar58 >= sVar60) * sVar58,
                                                CONCAT22((ushort)(sVar57 < sVar35) * sVar35 |
                                                         (ushort)(sVar57 >= sVar35) * sVar57,
                                                         (ushort)(sVar50 < sVar30) * sVar30 |
                                                         (ushort)(sVar50 >= sVar30) * sVar50)));
                  sVar30 = auVar61._8_2_;
                  sVar35 = auVar63._8_2_;
                  auVar53._8_2_ =
                       (ushort)(sVar35 < sVar30) * sVar30 | (ushort)(sVar35 >= sVar30) * sVar35;
                  sVar30 = auVar61._10_2_;
                  sVar35 = auVar63._10_2_;
                  auVar53._10_2_ =
                       (ushort)(sVar35 < sVar30) * sVar30 | (ushort)(sVar35 >= sVar30) * sVar35;
                  sVar30 = auVar61._12_2_;
                  sVar35 = auVar63._12_2_;
                  sVar60 = auVar63._14_2_;
                  auVar53._12_2_ =
                       (ushort)(sVar35 < sVar30) * sVar30 | (ushort)(sVar35 >= sVar30) * sVar35;
                  sVar30 = auVar61._14_2_;
                  auVar53._14_2_ =
                       (ushort)(sVar60 < sVar30) * sVar30 | (ushort)(sVar60 >= sVar30) * sVar60;
                  iVar14 = iVar14 + -1;
                  auVar61 = auVar53;
                } while (iVar14 != 0);
                auVar54._0_8_ = auVar53._0_8_ << 0x10;
                auVar54._8_8_ = auVar53._8_8_ << 0x10 | (ulong)uVar64;
                auVar55 = paddsw(auVar54,ZEXT416(uVar13 & 0xffff));
                sVar30 = auVar55._0_2_;
                auVar45._0_2_ =
                     (ushort)((short)uVar62 < sVar30) * sVar30 | ((short)uVar62 >= sVar30) * uVar62;
                sVar30 = auVar55._2_2_;
                auVar45._2_2_ =
                     (ushort)((short)uVar41 < sVar30) * sVar30 | ((short)uVar41 >= sVar30) * uVar41;
                sVar30 = auVar55._4_2_;
                auVar45._4_2_ =
                     (ushort)((short)uVar47 < sVar30) * sVar30 | ((short)uVar47 >= sVar30) * uVar47;
                sVar30 = auVar55._6_2_;
                auVar45._6_2_ =
                     (ushort)((short)uVar48 < sVar30) * sVar30 | ((short)uVar48 >= sVar30) * uVar48;
                sVar30 = auVar55._8_2_;
                auVar45._8_2_ =
                     (ushort)((short)uVar49 < sVar30) * sVar30 | ((short)uVar49 >= sVar30) * uVar49;
                sVar30 = auVar55._10_2_;
                auVar45._10_2_ =
                     (ushort)((short)auVar42._8_2_ < sVar30) * sVar30 |
                     ((short)auVar42._8_2_ >= sVar30) * auVar42._8_2_;
                sVar30 = auVar55._12_2_;
                auVar45._12_2_ =
                     (ushort)((short)auVar42._10_2_ < sVar30) * sVar30 |
                     ((short)auVar42._10_2_ >= sVar30) * auVar42._10_2_;
                sVar30 = auVar55._14_2_;
                auVar45._14_2_ =
                     (ushort)((short)auVar42._12_2_ < sVar30) * sVar30 |
                     ((short)auVar42._12_2_ >= sVar30) * auVar42._12_2_;
                lVar23 = 0;
                auVar63 = auVar56;
                auVar40 = auVar46;
                do {
                  auVar7._4_4_ = uVar31;
                  auVar7._0_4_ = uVar31;
                  auVar7._8_4_ = uVar31;
                  auVar7._12_4_ = uVar31;
                  auVar56 = psubsw(auVar55,auVar7);
                  auVar46 = psubsw(auVar45,auVar37);
                  sVar30 = auVar46._0_2_;
                  sVar35 = auVar56._0_2_;
                  auVar55._0_2_ =
                       (ushort)(sVar35 < sVar30) * sVar30 | (ushort)(sVar35 >= sVar30) * sVar35;
                  sVar30 = auVar46._2_2_;
                  sVar35 = auVar56._2_2_;
                  auVar55._2_2_ =
                       (ushort)(sVar35 < sVar30) * sVar30 | (ushort)(sVar35 >= sVar30) * sVar35;
                  sVar30 = auVar46._4_2_;
                  sVar35 = auVar56._4_2_;
                  auVar55._4_2_ =
                       (ushort)(sVar35 < sVar30) * sVar30 | (ushort)(sVar35 >= sVar30) * sVar35;
                  sVar30 = auVar46._6_2_;
                  sVar35 = auVar56._6_2_;
                  auVar55._6_2_ =
                       (ushort)(sVar35 < sVar30) * sVar30 | (ushort)(sVar35 >= sVar30) * sVar35;
                  sVar30 = auVar46._8_2_;
                  sVar35 = auVar56._8_2_;
                  auVar55._8_2_ =
                       (ushort)(sVar35 < sVar30) * sVar30 | (ushort)(sVar35 >= sVar30) * sVar35;
                  sVar30 = auVar46._10_2_;
                  sVar35 = auVar56._10_2_;
                  auVar55._10_2_ =
                       (ushort)(sVar35 < sVar30) * sVar30 | (ushort)(sVar35 >= sVar30) * sVar35;
                  sVar30 = auVar46._12_2_;
                  sVar35 = auVar56._12_2_;
                  sVar60 = auVar56._14_2_;
                  auVar55._12_2_ =
                       (ushort)(sVar35 < sVar30) * sVar30 | (ushort)(sVar35 >= sVar30) * sVar35;
                  sVar30 = auVar46._14_2_;
                  auVar55._14_2_ =
                       (ushort)(sVar60 < sVar30) * sVar30 | (ushort)(sVar60 >= sVar30) * sVar60;
                  psVar2 = (short *)((long)*ptr_01 + lVar23);
                  sVar30 = *psVar2;
                  sVar35 = psVar2[1];
                  sVar60 = psVar2[2];
                  sVar5 = psVar2[3];
                  sVar50 = psVar2[4];
                  sVar57 = psVar2[5];
                  sVar58 = psVar2[6];
                  sVar59 = psVar2[7];
                  auVar45._0_2_ =
                       (sVar30 < (short)auVar55._0_2_) * auVar55._0_2_ |
                       (ushort)(sVar30 >= (short)auVar55._0_2_) * sVar30;
                  auVar45._2_2_ =
                       (sVar35 < (short)auVar55._2_2_) * auVar55._2_2_ |
                       (ushort)(sVar35 >= (short)auVar55._2_2_) * sVar35;
                  auVar45._4_2_ =
                       (sVar60 < (short)auVar55._4_2_) * auVar55._4_2_ |
                       (ushort)(sVar60 >= (short)auVar55._4_2_) * sVar60;
                  auVar45._6_2_ =
                       (sVar5 < (short)auVar55._6_2_) * auVar55._6_2_ |
                       (ushort)(sVar5 >= (short)auVar55._6_2_) * sVar5;
                  auVar45._8_2_ =
                       (sVar50 < (short)auVar55._8_2_) * auVar55._8_2_ |
                       (ushort)(sVar50 >= (short)auVar55._8_2_) * sVar50;
                  auVar45._10_2_ =
                       (sVar57 < (short)auVar55._10_2_) * auVar55._10_2_ |
                       (ushort)(sVar57 >= (short)auVar55._10_2_) * sVar57;
                  auVar45._12_2_ =
                       (sVar58 < (short)auVar55._12_2_) * auVar55._12_2_ |
                       (ushort)(sVar58 >= (short)auVar55._12_2_) * sVar58;
                  auVar45._14_2_ =
                       (sVar59 < (short)auVar55._14_2_) * auVar55._14_2_ |
                       (ushort)(sVar59 >= (short)auVar55._14_2_) * sVar59;
                  *(undefined1 (*) [16])((long)*ptr_02 + lVar23) = auVar45;
                  sVar30 = auVar40._0_2_;
                  auVar46._0_2_ =
                       ((short)auVar45._0_2_ < sVar30) * auVar45._0_2_ |
                       (ushort)((short)auVar45._0_2_ >= sVar30) * sVar30;
                  sVar30 = auVar40._2_2_;
                  auVar46._2_2_ =
                       ((short)auVar45._2_2_ < sVar30) * auVar45._2_2_ |
                       (ushort)((short)auVar45._2_2_ >= sVar30) * sVar30;
                  sVar30 = auVar40._4_2_;
                  auVar46._4_2_ =
                       ((short)auVar45._4_2_ < sVar30) * auVar45._4_2_ |
                       (ushort)((short)auVar45._4_2_ >= sVar30) * sVar30;
                  sVar30 = auVar40._6_2_;
                  auVar46._6_2_ =
                       ((short)auVar45._6_2_ < sVar30) * auVar45._6_2_ |
                       (ushort)((short)auVar45._6_2_ >= sVar30) * sVar30;
                  sVar30 = auVar40._8_2_;
                  auVar46._8_2_ =
                       ((short)auVar45._8_2_ < sVar30) * auVar45._8_2_ |
                       (ushort)((short)auVar45._8_2_ >= sVar30) * sVar30;
                  sVar30 = auVar40._10_2_;
                  auVar46._10_2_ =
                       ((short)auVar45._10_2_ < sVar30) * auVar45._10_2_ |
                       (ushort)((short)auVar45._10_2_ >= sVar30) * sVar30;
                  sVar30 = auVar40._12_2_;
                  sVar35 = auVar40._14_2_;
                  auVar46._12_2_ =
                       ((short)auVar45._12_2_ < sVar30) * auVar45._12_2_ |
                       (ushort)((short)auVar45._12_2_ >= sVar30) * sVar30;
                  auVar46._14_2_ =
                       ((short)auVar45._14_2_ < sVar35) * auVar45._14_2_ |
                       (ushort)((short)auVar45._14_2_ >= sVar35) * sVar35;
                  sVar30 = auVar63._0_2_;
                  auVar56._0_2_ =
                       (sVar30 < (short)auVar45._0_2_) * auVar45._0_2_ |
                       (ushort)(sVar30 >= (short)auVar45._0_2_) * sVar30;
                  sVar30 = auVar63._2_2_;
                  auVar56._2_2_ =
                       (sVar30 < (short)auVar45._2_2_) * auVar45._2_2_ |
                       (ushort)(sVar30 >= (short)auVar45._2_2_) * sVar30;
                  sVar30 = auVar63._4_2_;
                  auVar56._4_2_ =
                       (sVar30 < (short)auVar45._4_2_) * auVar45._4_2_ |
                       (ushort)(sVar30 >= (short)auVar45._4_2_) * sVar30;
                  sVar30 = auVar63._6_2_;
                  auVar56._6_2_ =
                       (sVar30 < (short)auVar45._6_2_) * auVar45._6_2_ |
                       (ushort)(sVar30 >= (short)auVar45._6_2_) * sVar30;
                  sVar30 = auVar63._8_2_;
                  auVar56._8_2_ =
                       (sVar30 < (short)auVar45._8_2_) * auVar45._8_2_ |
                       (ushort)(sVar30 >= (short)auVar45._8_2_) * sVar30;
                  sVar30 = auVar63._10_2_;
                  auVar56._10_2_ =
                       (sVar30 < (short)auVar45._10_2_) * auVar45._10_2_ |
                       (ushort)(sVar30 >= (short)auVar45._10_2_) * sVar30;
                  sVar30 = auVar63._12_2_;
                  sVar35 = auVar63._14_2_;
                  auVar56._12_2_ =
                       (sVar30 < (short)auVar45._12_2_) * auVar45._12_2_ |
                       (ushort)(sVar30 >= (short)auVar45._12_2_) * sVar30;
                  auVar56._14_2_ =
                       (sVar35 < (short)auVar45._14_2_) * auVar45._14_2_ |
                       (ushort)(sVar35 >= (short)auVar45._14_2_) * sVar35;
                  lVar23 = lVar23 + 0x10;
                  auVar63 = auVar56;
                  auVar40 = auVar46;
                } while (lVar20 != lVar23);
              } while (uVar24 != uVar25);
              uVar28 = ptr_02[(uint)(iVar18 % iVar27)][0];
              uVar25 = ptr_02[(uint)(iVar18 % iVar27)][1];
              if (iVar18 / iVar27 < 7) {
                iVar14 = 1;
                if (1 < iVar12) {
                  iVar14 = iVar12;
                }
                do {
                  uVar25 = uVar25 << 0x10 | uVar28 >> 0x30;
                  iVar14 = iVar14 + -1;
                  uVar28 = uVar28 << 0x10;
                } while (iVar14 != 0);
              }
              sVar30 = auVar32._0_2_;
              auVar34._0_2_ = -(ushort)((short)auVar46._0_2_ < sVar30);
              sVar35 = auVar32._2_2_;
              auVar34._2_2_ = -(ushort)((short)auVar46._2_2_ < sVar35);
              auVar34._4_2_ = -(ushort)((short)auVar46._4_2_ < sVar30);
              auVar34._6_2_ = -(ushort)((short)auVar46._6_2_ < sVar35);
              auVar34._8_2_ = -(ushort)((short)auVar46._8_2_ < sVar30);
              auVar34._10_2_ = -(ushort)((short)auVar46._10_2_ < sVar35);
              auVar34._12_2_ = -(ushort)((short)auVar46._12_2_ < sVar30);
              auVar34._14_2_ = -(ushort)((short)auVar46._14_2_ < sVar35);
              sVar30 = auVar36._0_2_;
              auVar32._0_2_ = -(ushort)(sVar30 < (short)auVar56._0_2_);
              sVar35 = auVar36._2_2_;
              auVar32._2_2_ = -(ushort)(sVar35 < (short)auVar56._2_2_);
              auVar32._4_2_ = -(ushort)(sVar30 < (short)auVar56._4_2_);
              auVar32._6_2_ = -(ushort)(sVar35 < (short)auVar56._6_2_);
              auVar32._8_2_ = -(ushort)(sVar30 < (short)auVar56._8_2_);
              auVar32._10_2_ = -(ushort)(sVar35 < (short)auVar56._10_2_);
              auVar32._12_2_ = -(ushort)(sVar30 < (short)auVar56._12_2_);
              auVar32._14_2_ = -(ushort)(sVar35 < (short)auVar56._14_2_);
              auVar32 = auVar32 | auVar34;
              if ((((((((((((((((auVar32 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                               (auVar32 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                              (auVar32 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                             (auVar32 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar32 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar32 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar32 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar32 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar32 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar32 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar32 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar32 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar32 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar32 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar32 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar32[0xf]) {
                sVar30 = (short)(uVar25 >> 0x30);
              }
              else {
                *(byte *)&ppVar10->flag = (byte)ppVar10->flag | 0x40;
                sVar30 = 0;
                iVar11 = 0;
                iVar18 = 0;
              }
              ppVar10->score = (int)sVar30;
              ppVar10->end_query = iVar18;
              ppVar10->end_ref = iVar11;
              parasail_free(ptr_03);
              parasail_free(ptr_02);
              parasail_free(ptr_01);
              parasail_free(ptr_00);
              parasail_free(ptr);
              return ppVar10;
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvE = NULL;
    int16_t* restrict boundary = NULL;
    __m128i* restrict pvHt = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    __m128i vZero;
    int16_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP = (__m128i*)profile->profile16.score;
    vGapO = _mm_set1_epi16(open);
    vGapE = _mm_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInfFront = vZero;
    vNegInfFront = _mm_insert_epi16(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_adds_epi16(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi16(-segLen*gap), 2));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int16_t(16, s2Len+1);
    pvHt= parasail_memalign___m128i(16, segLen);
    pvH = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!boundary) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvGapper) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_16_t h;
            __m128i_16_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
            }
            _mm_store_si128(&pvH[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT16_MIN ? INT16_MIN : tmp;
        }
    }

    {
        __m128i vGapper = _mm_subs_epi16(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            vGapper = _mm_subs_epi16(vGapper, vGapE);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vHt;
        __m128i vF;
        __m128i vH;
        __m128i vHp;
        __m128i *pvW;
        __m128i vW;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHp = _mm_slli_si128(vHp, 2);
        vHp = _mm_insert_epi16(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm_subs_epi16(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vE = _mm_load_si128(pvE+i);
            vW = _mm_load_si128(pvW+i);
            vE = _mm_max_epi16(
                    _mm_subs_epi16(vE, vGapE),
                    _mm_subs_epi16(vH, vGapO));
            vHp = _mm_adds_epi16(vHp, vW);
            vF = _mm_max_epi16(vF, _mm_adds_epi16(vHt, pvGapper[i]));
            vHt = _mm_max_epi16(vE, vHp);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvHt+i, vHt);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 2);
        vHt = _mm_insert_epi16(vHt, boundary[j+1], 0);
        vF = _mm_max_epi16(vF, _mm_adds_epi16(vHt, pvGapper[0]));
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 2);
            vFt = _mm_adds_epi16(vFt, vSegLenXgap);
            vF = _mm_max_epi16(vF, vFt);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 2);
        vF = _mm_adds_epi16(vF, vNegInfFront);
        vH = _mm_max_epi16(vHt, vF);
        for (i=0; i<segLen; ++i) {
            vHt = _mm_load_si128(pvHt+i);
            vF = _mm_max_epi16(
                    _mm_subs_epi16(vF, vGapE),
                    _mm_subs_epi16(vH, vGapO));
            vH = _mm_max_epi16(vHt, vF);
            _mm_store_si128(pvH+i, vH);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
        } 


#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 2);
            }
            result->rowcols->score_row[j] = (int16_t) _mm_extract_epi16 (vH, 7);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m128i vH = _mm_load_si128(pvH + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128(vH, 2);
        }
        score = (int16_t) _mm_extract_epi16 (vH, 7);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(boundary);
    parasail_free(pvE);

    return result;
}